

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestIterationStart
          (PrettyUnitTestResultPrinter *this,UnitTest *unit_test,int iteration)

{
  _Alloc_hider _Var1;
  long *plVar2;
  bool bVar3;
  int iVar4;
  int32_t iVar5;
  uint uVar6;
  char *pcVar7;
  pointer ppTVar8;
  testing *this_00;
  char *in_R8;
  string f;
  string local_80;
  long *local_60 [2];
  long local_50 [2];
  string local_40;
  
  if (FLAGS_gtest_repeat != 1) {
    printf("\nRepeating all tests (iteration %d) . . .\n\n",(ulong)(iteration + 1));
  }
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,FLAGS_gtest_filter_abi_cxx11_,
             DAT_0059b0d0 + FLAGS_gtest_filter_abi_cxx11_);
  plVar2 = local_60[0];
  if (local_60[0] != (long *)0x0) {
    iVar4 = strcmp((char *)local_60[0],"*");
    if (iVar4 == 0) goto LAB_0035934b;
  }
  ColoredPrintf(kYellow,"Note: %s filter = %s\n","Google Test",plVar2);
LAB_0035934b:
  bVar3 = ShouldShard("GTEST_TOTAL_SHARDS","GTEST_SHARD_INDEX",false);
  if (bVar3) {
    iVar5 = Int32FromEnvOrDie("GTEST_SHARD_INDEX",-1);
    pcVar7 = getenv("GTEST_TOTAL_SHARDS");
    ColoredPrintf(kYellow,"Note: This is test shard %d of %s.\n",(ulong)(iVar5 + 1),pcVar7);
  }
  if (FLAGS_gtest_shuffle == '\x01') {
    ColoredPrintf(kYellow,"Note: Randomizing tests\' orders with a seed of %d .\n",
                  (ulong)(uint)unit_test->impl_->random_seed_);
  }
  ColoredPrintf(kGreen,"[==========] ");
  uVar6 = UnitTestImpl::test_to_run_count(unit_test->impl_);
  FormatCountableNoun_abi_cxx11_(&local_80,(testing *)(ulong)uVar6,0x4b1d75,"tests",in_R8);
  _Var1._M_p = local_80._M_dataplus._M_p;
  this_00 = (testing *)0x0;
  for (ppTVar8 = (unit_test->impl_->test_suites_).
                 super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppTVar8 !=
      (unit_test->impl_->test_suites_).
      super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppTVar8 = ppTVar8 + 1) {
    this_00 = (testing *)(ulong)((int)this_00 + (uint)(*ppTVar8)->should_run_);
  }
  FormatCountableNoun_abi_cxx11_(&local_40,this_00,0x4b3d51,"test suites",in_R8);
  printf("Running %s from %s.\n",_Var1._M_p,local_40._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  fflush(_stdout);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestIterationStart(
    const UnitTest& unit_test, int iteration) {
  if (GTEST_FLAG_GET(repeat) != 1)
    printf("\nRepeating all tests (iteration %d) . . .\n\n", iteration + 1);

  std::string f = GTEST_FLAG_GET(filter);
  const char* const filter = f.c_str();

  // Prints the filter if it's not *.  This reminds the user that some
  // tests may be skipped.
  if (!String::CStringEquals(filter, kUniversalFilter)) {
    ColoredPrintf(GTestColor::kYellow, "Note: %s filter = %s\n", GTEST_NAME_,
                  filter);
  }

  if (internal::ShouldShard(kTestTotalShards, kTestShardIndex, false)) {
    const int32_t shard_index = Int32FromEnvOrDie(kTestShardIndex, -1);
    ColoredPrintf(GTestColor::kYellow, "Note: This is test shard %d of %s.\n",
                  static_cast<int>(shard_index) + 1,
                  internal::posix::GetEnv(kTestTotalShards));
  }

  if (GTEST_FLAG_GET(shuffle)) {
    ColoredPrintf(GTestColor::kYellow,
                  "Note: Randomizing tests' orders with a seed of %d .\n",
                  unit_test.random_seed());
  }

  ColoredPrintf(GTestColor::kGreen, "[==========] ");
  printf("Running %s from %s.\n",
         FormatTestCount(unit_test.test_to_run_count()).c_str(),
         FormatTestSuiteCount(unit_test.test_suite_to_run_count()).c_str());
  fflush(stdout);
}